

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Type __thiscall
wabt::anon_unknown_4::Validator::GetDeclarationType(Validator *this,FuncDeclaration *decl)

{
  Type *pTVar1;
  Type *pTVar2;
  Index code;
  Type in_RAX;
  char *pcVar3;
  undefined8 uVar4;
  int in_EDX;
  Type local_8;
  undefined8 uVar5;
  
  local_8 = in_RAX;
  if (decl->has_func_type == true) {
    pcVar3 = Var::index(&decl->type_var,(char *)&decl->type_var,in_EDX);
    code = (Index)pcVar3;
  }
  else {
    if ((decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pTVar1 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (decl->sig).result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar1 == pTVar2) {
        uVar4._0_4_ = Void;
        uVar4._4_4_ = 0;
        return (Type)uVar4;
      }
      if ((long)pTVar2 - (long)pTVar1 == 8) {
        uVar5._0_4_ = pTVar1->enum_;
        uVar5._4_4_ = pTVar1->type_index_;
        return (Type)uVar5;
      }
    }
    code = Module::GetFuncTypeIndex(this->current_module_,decl);
  }
  Type::Type(&local_8,code);
  return local_8;
}

Assistant:

Type Validator::GetDeclarationType(const FuncDeclaration& decl) {
  if (decl.has_func_type) {
    return Type(decl.type_var.index());
  }
  if (decl.sig.param_types.empty()) {
    if (decl.sig.result_types.empty()) {
      return Type::Void;
    }
    if (decl.sig.result_types.size() == 1) {
      return decl.sig.result_types[0];
    }
  }
  return Type(current_module_->GetFuncTypeIndex(decl));
}